

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O2

void __thiscall gutil::PropertyNode::PropertyNode(PropertyNode *this,string *_name)

{
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  (this->list).
  super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list).
  super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::shared_ptr<gutil::PropertyNode>,_std::allocator<std::shared_ptr<gutil::PropertyNode>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((_name->_M_string_length != 0) && ((int)*(_name->_M_dataplus)._M_p - 0x30U < 10)) {
    std::__cxx11::string::assign((char *)this);
  }
  std::__cxx11::string::append((string *)this);
  return;
}

Assistant:

PropertyNode(const std::string &_name)
    {
      if (_name.size() > 0 && std::isdigit(_name[0]))
      {
        // name must not begin with a digit!
        name="x";
      }

      name.append(_name);
    }